

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_test.cc
# Opt level: O0

void anon_unknown.dwarf_178405::CompareDigest
               (DigestTestVector *test,uint8_t *digest,size_t digest_len)

{
  bool bVar1;
  char *message;
  AssertHelper local_80;
  Message local_78 [3];
  Span<const_unsigned_char> local_60;
  string local_50;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  size_t digest_len_local;
  uint8_t *digest_local;
  DigestTestVector *test_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )digest_len;
  bssl::Span<const_unsigned_char>::Span(&local_60,digest,digest_len);
  EncodeHex_abi_cxx11_(&local_50,local_60);
  testing::internal::EqHelper::
  Compare<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_30,"test->expected_hex","EncodeHex(bssl::Span(digest, digest_len))",
             &test->expected_hex,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_78);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_test.cc"
               ,0xa0,message);
    testing::internal::AssertHelper::operator=(&local_80,local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

static void CompareDigest(const DigestTestVector *test, const uint8_t *digest,
                          size_t digest_len) {
  EXPECT_EQ(test->expected_hex, EncodeHex(bssl::Span(digest, digest_len)));
}